

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry(char **p,char *prefix,wchar_t tag,char *name,wchar_t perm,wchar_t id)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  size_t sVar3;
  char *in_RCX;
  char **p_00;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  uint in_R8D;
  int in_R9D;
  wchar_t in_stack_ffffffffffffffcc;
  int local_28;
  char *local_20;
  
  if (in_RSI != (char *)0x0) {
    strcpy((char *)*in_RDI,in_RSI);
    sVar3 = strlen((char *)*in_RDI);
    *in_RDI = sVar3 + *in_RDI;
  }
  p_00 = (char **)(ulong)(in_EDX - 0x2711);
  local_28 = in_R9D;
  local_20 = in_RCX;
  switch(p_00) {
  case (char **)0x1:
    local_20 = (char *)0x0;
    local_28 = -1;
  case (char **)0x0:
    strcpy((char *)*in_RDI,"user");
    break;
  case (char **)0x3:
    local_20 = (char *)0x0;
    local_28 = -1;
  case (char **)0x2:
    strcpy((char *)*in_RDI,"group");
    break;
  case (char **)0x4:
    strcpy((char *)*in_RDI,"mask");
    local_20 = (char *)0x0;
    local_28 = -1;
    break;
  case (char **)0x5:
    strcpy((char *)*in_RDI,"other");
    local_20 = (char *)0x0;
    local_28 = -1;
  }
  sVar3 = strlen((char *)*in_RDI);
  *in_RDI = sVar3 + *in_RDI;
  puVar1 = (undefined1 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = 0x3a;
  if (local_20 == (char *)0x0) {
    if ((in_EDX == 0x2711) || (in_EDX == 0x2713)) {
      append_id(p_00,in_stack_ffffffffffffffcc);
      local_28 = -1;
    }
  }
  else {
    strcpy((char *)*in_RDI,local_20);
    sVar3 = strlen((char *)*in_RDI);
    *in_RDI = sVar3 + *in_RDI;
  }
  puVar1 = (undefined1 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = 0x3a;
  uVar2 = 0x2d;
  if ((in_R8D & 0x124) != 0) {
    uVar2 = 0x72;
  }
  puVar1 = (undefined1 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar2;
  uVar2 = 0x2d;
  if ((in_R8D & 0x92) != 0) {
    uVar2 = 0x77;
  }
  puVar1 = (undefined1 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar2;
  uVar2 = 0x2d;
  if ((in_R8D & 0x49) != 0) {
    uVar2 = 0x78;
  }
  puVar1 = (undefined1 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar2;
  if (local_28 != -1) {
    puVar1 = (undefined1 *)*in_RDI;
    *in_RDI = (long)(puVar1 + 1);
    *puVar1 = 0x3a;
    append_id(p_00,in_stack_ffffffffffffffcc);
  }
  *(undefined1 *)*in_RDI = 0;
  return;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int tag,
    const char *name, int perm, int id)
{
	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (name != NULL) {
		strcpy(*p, name);
		*p += strlen(*p);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id(p, id);
		id = -1;
	}
	*(*p)++ = ':';
	*(*p)++ = (perm & 0444) ? 'r' : '-';
	*(*p)++ = (perm & 0222) ? 'w' : '-';
	*(*p)++ = (perm & 0111) ? 'x' : '-';
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
	**p = '\0';
}